

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

int __thiscall re2::DFA::BuildAllStates(DFA *this,DFAStateCallback *cb)

{
  byte bVar1;
  Prog *pPVar2;
  State *state;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  long lVar5;
  pointer piVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  __node_base_ptr p_Var10;
  mapped_type *pmVar11;
  size_type __n;
  int iVar12;
  int iVar13;
  int *piVar14;
  long lVar15;
  int iVar16;
  __node_base_ptr p_Var17;
  State *ns;
  vector<int,_std::allocator<int>_> input;
  RWLocker l;
  vector<int,_std::allocator<int>_> output;
  deque<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> q;
  unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
  m;
  State *local_178;
  ulong local_170;
  undefined4 local_164;
  DFAStateCallback *local_160;
  vector<int,_std::allocator<int>_> local_158;
  RWLocker local_140;
  vector<int,_std::allocator<int>_> local_130;
  _Deque_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> local_118;
  _Hashtable<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_c0;
  SearchParams local_88;
  
  iVar8 = 0;
  if (this->init_failed_ == false) {
    local_140.mu_ = &this->cache_mutex_;
    local_140.writing_ = false;
    local_160 = cb;
    iVar8 = pthread_rwlock_rdlock((pthread_rwlock_t *)local_140.mu_);
    if (iVar8 != 0) {
      abort();
    }
    local_88.text.data_ = (const_pointer)0x0;
    local_88.text.size_ = 0;
    local_88.start = (State *)0x0;
    local_88.context.data_ = (const_pointer)0x0;
    local_88.context.size_._0_7_ = 0;
    local_88.context.size_._7_1_ = 0;
    local_88.want_earliest_match = false;
    local_88.run_forward = false;
    local_88.first_byte = -1;
    local_88.cache_lock = &local_140;
    iVar8 = 0;
    local_88.failed = false;
    local_88.ep = (char *)0x0;
    local_88.matches = (SparseSet *)0x0;
    local_88.anchored = false;
    bVar7 = AnalyzeSearch(this,&local_88);
    if (bVar7 && (State *)0x1 < local_88.start) {
      local_c0._M_buckets = &local_c0._M_single_bucket;
      local_c0._M_bucket_count = 1;
      local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_c0._M_element_count = 0;
      local_c0._M_rehash_policy._M_max_load_factor = 1.0;
      local_c0._M_rehash_policy._M_next_resize = 0;
      local_c0._M_single_bucket = (__node_base_ptr)0x0;
      local_118._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_118._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_118._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_118._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_118._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_118._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_118._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_118._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_118._M_impl.super__Deque_impl_data._M_map_size = 0;
      std::_Deque_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::_M_initialize_map
                (&local_118,0);
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = (int)local_c0._M_element_count;
      std::
      _Hashtable<re2::DFA::State*,std::pair<re2::DFA::State*const,int>,std::allocator<std::pair<re2::DFA::State*const,int>>,std::__detail::_Select1st,std::equal_to<re2::DFA::State*>,std::hash<re2::DFA::State*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<re2::DFA::State*&,int>
                ((_Hashtable<re2::DFA::State*,std::pair<re2::DFA::State*const,int>,std::allocator<std::pair<re2::DFA::State*const,int>>,std::__detail::_Select1st,std::equal_to<re2::DFA::State*>,std::hash<re2::DFA::State*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_c0,&local_88.start);
      if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_118._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<re2::DFA::State*,std::allocator<re2::DFA::State*>>::
        _M_push_back_aux<re2::DFA::State*const&>
                  ((deque<re2::DFA::State*,std::allocator<re2::DFA::State*>> *)&local_118,
                   &local_88.start);
      }
      else {
        *local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = local_88.start;
        local_118._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_118._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      __n = (long)this->prog_->bytemap_range_ + 1;
      std::vector<int,_std::allocator<int>_>::vector(&local_158,__n,(allocator_type *)&local_130);
      pPVar2 = this->prog_;
      iVar8 = 0;
      do {
        bVar1 = pPVar2->bytemap_[iVar8];
        iVar16 = 0xff;
        if (0xff < iVar8) {
          iVar16 = iVar8;
        }
        iVar12 = iVar8 + -1;
        lVar15 = (long)iVar8;
        do {
          iVar13 = iVar16;
          if (0xfe < lVar15) break;
          iVar12 = iVar12 + 1;
          lVar5 = lVar15 + 1;
          lVar15 = lVar15 + 1;
          iVar13 = iVar12;
        } while (pPVar2->bytemap_[lVar5] == bVar1);
        *(int *)(CONCAT44(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + (ulong)bVar1 * 4) = iVar13;
        iVar8 = iVar13 + 1;
      } while (iVar13 < 0xff);
      *(undefined4 *)
       (CONCAT44(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + (long)this->prog_->bytemap_range_ * 4) =
           0x100;
      std::vector<int,_std::allocator<int>_>::vector(&local_130,__n,(allocator_type *)&local_178);
      local_170 = 0;
      do {
        if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_118._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        state = *local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (local_118._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_118._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_118._M_impl.super__Deque_impl_data._M_start._M_first);
          local_118._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_118._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_118._M_impl.super__Deque_impl_data._M_start._M_last =
               local_118._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
          local_118._M_impl.super__Deque_impl_data._M_start._M_first =
               local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_118._M_impl.super__Deque_impl_data._M_start._M_node =
               local_118._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_118._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_118._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        piVar6 = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar14 = (int *)CONCAT44(local_158.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_158.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_);
            piVar14 != piVar6; piVar14 = piVar14 + 1) {
          iVar8 = *piVar14;
          local_178 = RunStateOnByteUnlocked(this,state,iVar8);
          if (local_178 == (State *)0x0) {
            iVar8 = 9;
            local_170 = 1;
          }
          else if (local_178 == (State *)0x1) {
            if (iVar8 == 0x100) {
              uVar9 = this->prog_->bytemap_range_;
            }
            else {
              uVar9 = (uint)this->prog_->bytemap_[iVar8];
            }
            local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(int)uVar9] = -1;
            iVar8 = 10;
          }
          else {
            p_Var3 = local_c0._M_buckets[(ulong)local_178 % local_c0._M_bucket_count];
            p_Var10 = (__node_base_ptr)0x0;
            if ((p_Var3 != (__node_base_ptr)0x0) &&
               (p_Var10 = p_Var3, p_Var17 = p_Var3->_M_nxt,
               local_178 != (State *)p_Var3->_M_nxt[1]._M_nxt)) {
              while (p_Var4 = p_Var17->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
                p_Var10 = (__node_base_ptr)0x0;
                if (((ulong)p_Var4[1]._M_nxt % local_c0._M_bucket_count !=
                     (ulong)local_178 % local_c0._M_bucket_count) ||
                   (p_Var10 = p_Var17, p_Var17 = p_Var4, local_178 == (State *)p_Var4[1]._M_nxt))
                goto LAB_001c5b78;
              }
              p_Var10 = (__node_base_ptr)0x0;
            }
LAB_001c5b78:
            if ((p_Var10 == (__node_base_ptr)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
              local_164 = (int)local_c0._M_element_count;
              std::
              _Hashtable<re2::DFA::State*,std::pair<re2::DFA::State*const,int>,std::allocator<std::pair<re2::DFA::State*const,int>>,std::__detail::_Select1st,std::equal_to<re2::DFA::State*>,std::hash<re2::DFA::State*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<re2::DFA::State*&,int>
                        ((_Hashtable<re2::DFA::State*,std::pair<re2::DFA::State*const,int>,std::allocator<std::pair<re2::DFA::State*const,int>>,std::__detail::_Select1st,std::equal_to<re2::DFA::State*>,std::hash<re2::DFA::State*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&local_c0,&local_178,&local_164);
              if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_118._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<re2::DFA::State*,std::allocator<re2::DFA::State*>>::
                _M_push_back_aux<re2::DFA::State*const&>
                          ((deque<re2::DFA::State*,std::allocator<re2::DFA::State*>> *)&local_118,
                           &local_178);
              }
              else {
                *local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = local_178;
                local_118._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_118._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
            }
            pmVar11 = std::__detail::
                      _Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&local_c0,&local_178);
            if (iVar8 == 0x100) {
              uVar9 = this->prog_->bytemap_range_;
            }
            else {
              uVar9 = (uint)this->prog_->bytemap_[iVar8];
            }
            local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(int)uVar9] = *pmVar11;
            iVar8 = 0;
          }
          if ((iVar8 != 10) && (iVar8 != 0)) break;
        }
        if (*(long *)(local_160 + 0x10) != 0) {
          piVar14 = local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((local_170 & 1) != 0) {
            piVar14 = (int *)0x0;
          }
          if (state == (State *)0x2) {
            bVar7 = true;
          }
          else {
            bVar7 = (bool)(*(byte *)((long)&state->flag_ + 1) & 1);
          }
          std::function<void_(const_int_*,_bool)>::operator()(local_160,piVar14,bVar7);
        }
      } while ((local_170 & 1) == 0);
      iVar8 = (int)local_c0._M_element_count;
      if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((void *)CONCAT44(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_158.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_158.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      std::_Deque_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::~_Deque_base
                (&local_118);
      std::
      _Hashtable<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_c0);
    }
    RWLocker::~RWLocker(&local_140);
  }
  return iVar8;
}

Assistant:

int DFA::BuildAllStates(const Prog::DFAStateCallback& cb) {
  if (!ok())
    return 0;

  // Pick out start state for unanchored search
  // at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(StringPiece(), StringPiece(), &l);
  params.anchored = false;
  if (!AnalyzeSearch(&params) ||
      params.start == NULL ||
      params.start == DeadState)
    return 0;

  // Add start state to work queue.
  // Note that any State* that we handle here must point into the cache,
  // so we can simply depend on pointer-as-a-number hashing and equality.
  std::unordered_map<State*, int> m;
  std::deque<State*> q;
  m.emplace(params.start, static_cast<int>(m.size()));
  q.push_back(params.start);

  // Compute the input bytes needed to cover all of the next pointers.
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  std::vector<int> input(nnext);
  for (int c = 0; c < 256; c++) {
    int b = prog_->bytemap()[c];
    while (c < 256-1 && prog_->bytemap()[c+1] == b)
      c++;
    input[b] = c;
  }
  input[prog_->bytemap_range()] = kByteEndText;

  // Scratch space for the output.
  std::vector<int> output(nnext);

  // Flood to expand every state.
  bool oom = false;
  while (!q.empty()) {
    State* s = q.front();
    q.pop_front();
    for (int c : input) {
      State* ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        oom = true;
        break;
      }
      if (ns == DeadState) {
        output[ByteMap(c)] = -1;
        continue;
      }
      if (m.find(ns) == m.end()) {
        m.emplace(ns, static_cast<int>(m.size()));
        q.push_back(ns);
      }
      output[ByteMap(c)] = m[ns];
    }
    if (cb)
      cb(oom ? NULL : output.data(),
         s == FullMatchState || s->IsMatch());
    if (oom)
      break;
  }

  return static_cast<int>(m.size());
}